

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# urlapi.c
# Opt level: O2

CURLUcode parseurl(char *url,CURLU *u,uint flags)

{
  byte bVar1;
  _Bool _Var2;
  byte bVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  CURLUcode CVar7;
  CURLcode CVar8;
  int iVar9;
  CURLUcode CVar10;
  size_t sVar11;
  byte *pbVar12;
  size_t sVar13;
  char *pcVar14;
  Curl_handler *pCVar15;
  long lVar16;
  uint uVar17;
  char *pcVar18;
  char **optionsp;
  byte *pbVar19;
  byte *pbVar20;
  ulong uVar21;
  char endbracket;
  uint local_9c;
  int len;
  char *local_90;
  byte *local_88;
  char *passwdp;
  char *userp;
  byte *local_70;
  char schemebuf [41];
  
  sVar11 = strlen(url);
  CVar10 = CURLUE_MALFORMED_INPUT;
  if (8000000 < sVar11) goto LAB_00141aea;
  local_9c = flags;
  pbVar12 = (byte *)(*Curl_cmalloc)(sVar11 * 2 + 2);
  u->scratch = (char *)pbVar12;
  if (pbVar12 != (byte *)0x0) {
    pbVar12[sVar11 + 1] = 0;
    _Var2 = Curl_is_absolute_url(url,schemebuf,0x29);
    if (_Var2) {
      sVar13 = strlen(schemebuf);
      iVar4 = Curl_strcasecompare(schemebuf,"file");
      if (iVar4 == 0) {
        *pbVar12 = 0;
        url = url + sVar13;
        uVar5 = 0xfffffffb;
        do {
          pcVar14 = url + 1;
          url = url + 1;
          uVar17 = uVar5 + 1;
          if (*pcVar14 != '/') break;
          uVar6 = uVar5 + 5;
          uVar5 = uVar17;
        } while (uVar6 < 4);
        if (0xfffffffc < uVar17) {
          pcVar14 = schemebuf;
          pCVar15 = Curl_builtin_scheme(pcVar14);
          if ((local_9c & 8) == 0 && pCVar15 == (Curl_handler *)0x0) {
            CVar10 = CURLUE_UNSUPPORTED_SCHEME;
            goto LAB_00141aea;
          }
          CVar10 = junkscan(pcVar14);
          if (CVar10 == CURLUE_OK) goto LAB_001414e0;
        }
        goto LAB_001415cb;
      }
      strcpy((char *)pbVar12,url + 5);
      pcVar14 = (*Curl_cstrdup)("file");
      u->scheme = pcVar14;
      if (pcVar14 == (char *)0x0) goto LAB_00141ae6;
      bVar3 = *pbVar12;
      pbVar19 = pbVar12;
      if (bVar3 == 0x2f) {
        if (pbVar12[1] == 0x2f) {
          pbVar19 = pbVar12 + 2;
          bVar3 = pbVar12[2];
          if (bVar3 != 0x2f) {
            if (((0x19 < (byte)((bVar3 & 0xdf) + 0xbf)) ||
                ((pbVar12[3] != 0x7c && (pbVar12[3] != 0x3a)))) ||
               ((bVar1 = pbVar12[4], bVar1 != 0 && ((bVar1 != 0x2f && (bVar1 != 0x5c)))))) {
              iVar4 = curl_strnequal("localhost/",(char *)pbVar19,10);
              if ((iVar4 == 0) &&
                 (iVar4 = curl_strnequal("127.0.0.1/",(char *)pbVar19,10), iVar4 == 0))
              goto LAB_001415cb;
              bVar3 = pbVar12[0xb];
              pbVar19 = pbVar12 + 0xb;
              if (bVar3 == 0x2f) goto LAB_00141668;
            }
            goto LAB_0014168e;
          }
        }
LAB_00141668:
        if (0x19 < (byte)((pbVar19[1] & 0xdf) + 0xbf)) {
LAB_001416d0:
          pbVar20 = (byte *)0x0;
          pbVar12 = pbVar19;
          goto LAB_0014179e;
        }
        if ((pbVar19[2] == 0x7c) || (pbVar19[2] == 0x3a)) {
          bVar3 = pbVar19[3];
LAB_001416ae:
          CVar10 = CURLUE_MALFORMED_INPUT;
          if (((bVar3 == 0) || (bVar3 == 0x2f)) || (bVar3 == 0x5c)) goto LAB_00141aea;
        }
      }
      else {
LAB_0014168e:
        if (0x19 < (byte)((bVar3 & 0xdf) + 0xbf)) goto LAB_001416d0;
        if ((pbVar19[1] == 0x7c) || (pbVar19[1] == 0x3a)) {
          bVar3 = pbVar19[2];
          goto LAB_001416ae;
        }
      }
      pbVar20 = (byte *)0x0;
      pbVar12 = pbVar19;
    }
    else {
      *pbVar12 = 0;
      if ((local_9c & 0x204) == 0) goto LAB_00141aea;
      pcVar14 = (char *)0x0;
      if ((local_9c & 4) != 0) {
        pcVar14 = "https";
      }
LAB_001414e0:
      pbVar20 = pbVar12 + sVar11 + 1;
      sVar11 = 0;
      while ((0x3f < (ulong)(byte)url[sVar11] ||
             ((0x8000800800000001U >> ((ulong)(byte)url[sVar11] & 0x3f) & 1) == 0))) {
        sVar11 = sVar11 + 1;
      }
      if (sVar11 == 0) {
LAB_001415cb:
        CVar10 = CURLUE_MALFORMED_INPUT;
        goto LAB_00141aea;
      }
      local_88 = (byte *)(url + sVar11);
      memcpy(pbVar20,url,sVar11);
      pbVar20[sVar11] = 0;
      if (pcVar14 == (char *)0x0 && (local_9c >> 9 & 1) != 0) {
        iVar4 = curl_strnequal("ftp.",(char *)pbVar20,4);
        if (iVar4 == 0) {
          iVar4 = curl_strnequal("dict.",(char *)pbVar20,5);
          if (iVar4 == 0) {
            iVar4 = curl_strnequal("ldap.",(char *)pbVar20,5);
            if (iVar4 == 0) {
              iVar4 = curl_strnequal("imap.",(char *)pbVar20,5);
              if (iVar4 == 0) {
                iVar4 = curl_strnequal("smtp.",(char *)pbVar20,5);
                if (iVar4 == 0) {
                  iVar4 = curl_strnequal("pop3.",(char *)pbVar20,5);
                  pcVar14 = "pop3";
                  if (iVar4 == 0) {
                    pcVar14 = "http";
                  }
                }
                else {
                  pcVar14 = "smtp";
                }
              }
              else {
                pcVar14 = "imap";
              }
            }
            else {
              pcVar14 = "ldap";
            }
          }
          else {
            pcVar14 = "dict";
          }
        }
        else {
          pcVar14 = "ftp";
        }
      }
      pbVar19 = local_88;
      sVar11 = strlen((char *)local_88);
      memcpy(pbVar12,pbVar19,sVar11);
      pbVar12[sVar11] = 0;
      pcVar14 = (*Curl_cstrdup)(pcVar14);
      u->scheme = pcVar14;
      if (pcVar14 == (char *)0x0) goto LAB_00141ae6;
    }
LAB_0014179e:
    CVar10 = CURLUE_MALFORMED_INPUT;
    pCVar15 = Curl_builtin_scheme(u->scheme);
    CVar7 = junkscan((char *)pbVar12);
    if (CVar7 != CURLUE_OK) goto LAB_00141aea;
    local_88 = pbVar20;
    pcVar14 = strchr((char *)pbVar12,0x3f);
    if (pcVar14 == (char *)0x0) {
      pbVar19 = (byte *)0x0;
    }
    else {
      pbVar19 = (byte *)(pcVar14 + 1);
      *pcVar14 = '\0';
    }
    pbVar20 = pbVar19;
    if (pbVar19 == (byte *)0x0) {
      pbVar20 = pbVar12;
    }
    pcVar14 = strchr((char *)pbVar20,0x23);
    if (pcVar14 == (char *)0x0) {
      local_90 = (char *)0x0;
    }
    else {
      local_90 = pcVar14 + 1;
      *pcVar14 = '\0';
    }
    if (*pbVar12 != 0) {
      if ((local_9c & 0x10) == 0) {
        local_70 = pbVar19;
        pcVar14 = Curl_dedotdotify((char *)pbVar12);
        if (pcVar14 == (char *)0x0) goto LAB_00141ae6;
        iVar4 = strcmp(pcVar14,(char *)pbVar12);
        if (iVar4 != 0) {
          u->path = pcVar14;
          pbVar19 = local_70;
          goto LAB_0014187f;
        }
        (*Curl_cfree)(pcVar14);
        pbVar19 = local_70;
      }
      pcVar14 = (*Curl_cstrdup)((char *)pbVar12);
      u->path = pcVar14;
      if (pcVar14 == (char *)0x0) goto LAB_00141ae6;
    }
LAB_0014187f:
    pbVar12 = local_88;
    if (local_88 != (byte *)0x0) {
      CVar7 = junkscan((char *)local_88);
      if (CVar7 != CURLUE_OK) goto LAB_00141aea;
      userp = (char *)0x0;
      passwdp = (char *)0x0;
      _len = (char *)0x0;
      pcVar14 = strchr((char *)pbVar12,0x40);
      if (pcVar14 == (char *)0x0) {
        CVar10 = CURLUE_OK;
        pcVar18 = (char *)0x0;
LAB_00141914:
        (*Curl_cfree)(pcVar18);
        (*Curl_cfree)(passwdp);
        (*Curl_cfree)(_len);
        if (pcVar14 != (char *)0x0) goto LAB_00141aea;
      }
      else {
        uVar21 = ~(ulong)pbVar12;
        if ((pCVar15 == (Curl_handler *)0x0) || ((pCVar15->flags & 0x400) == 0)) {
          optionsp = (char **)0x0;
        }
        else {
          optionsp = (char **)&len;
        }
        pbVar12 = (byte *)(pcVar14 + 1);
        CVar8 = Curl_parse_login_details
                          ((char *)local_88,(size_t)(pcVar14 + uVar21 + 1),&userp,&passwdp,optionsp)
        ;
        pcVar18 = userp;
        if (CVar8 != CURLE_OK) {
          CVar10 = CURLUE_MALFORMED_INPUT;
          goto LAB_00141914;
        }
        if (userp != (char *)0x0) {
          if ((local_9c & 0x20) != 0) {
            CVar10 = CURLUE_USER_NOT_ALLOWED;
            goto LAB_00141914;
          }
          u->user = userp;
        }
        if (passwdp != (char *)0x0) {
          u->password = passwdp;
        }
        if (_len != (char *)0x0) {
          u->options = _len;
        }
      }
      iVar4 = __isoc99_sscanf(pbVar12,"[%*45[0123456789abcdefABCDEF:.]%c%n",&endbracket);
      if (iVar4 == 1) {
        CVar10 = CURLUE_MALFORMED_INPUT;
        iVar4 = len;
        if (endbracket == '%') {
          iVar9 = __isoc99_sscanf(pbVar12 + len,"%*[^]]%c%n",&endbracket);
          if ((iVar9 != 1) || (endbracket != ']')) goto LAB_00141aea;
          iVar4 = iVar4 + len;
        }
        else if (endbracket != ']') goto LAB_00141aea;
        if (pbVar12[iVar4] != 0) {
          if (pbVar12[iVar4] != 0x3a) goto LAB_00141aea;
          pbVar20 = pbVar12 + iVar4;
          goto LAB_00141a0d;
        }
      }
      else {
        pbVar20 = (byte *)strchr((char *)pbVar12,0x3a);
        if (pbVar20 != (byte *)0x0) {
LAB_00141a0d:
          if (pbVar20[1] == 0) {
            *pbVar20 = 0;
          }
          else {
            iVar4 = Curl_isdigit((uint)pbVar20[1]);
            if (((iVar4 == 0) ||
                (lVar16 = strtol((char *)(pbVar20 + 1),&userp,10),
                lVar16 - 0x10000U < 0xffffffffffff0001)) || (*userp != '\0')) {
              CVar10 = CURLUE_BAD_PORT_NUMBER;
              goto LAB_00141aea;
            }
            *pbVar20 = 0;
            *userp = '\0';
            curl_msnprintf((char *)&passwdp,7,"%ld",lVar16);
            u->portnum = lVar16;
            pcVar14 = (*Curl_cstrdup)((char *)&passwdp);
            u->port = pcVar14;
            if (pcVar14 == (char *)0x0) {
              CVar10 = CURLUE_OUT_OF_MEMORY;
              goto LAB_00141aea;
            }
          }
        }
      }
      CVar10 = hostname_check(u,(char *)pbVar12);
      if (CVar10 != CURLUE_OK) goto LAB_00141aea;
      pcVar14 = (*Curl_cstrdup)((char *)pbVar12);
      u->host = pcVar14;
      if (pcVar14 == (char *)0x0) goto LAB_00141ae6;
    }
    if (pbVar19 != (byte *)0x0) {
      pcVar14 = (*Curl_cstrdup)((char *)pbVar19);
      u->query = pcVar14;
      if (pcVar14 == (char *)0x0) goto LAB_00141ae6;
    }
    if ((local_90 != (char *)0x0) && (*local_90 != '\0')) {
      pcVar14 = (*Curl_cstrdup)(local_90);
      u->fragment = pcVar14;
      CVar10 = CURLUE_OUT_OF_MEMORY;
      if (pcVar14 == (char *)0x0) goto LAB_00141aea;
    }
    (*Curl_cfree)(u->scratch);
    u->scratch = (char *)0x0;
    return CURLUE_OK;
  }
LAB_00141ae6:
  CVar10 = CURLUE_OUT_OF_MEMORY;
LAB_00141aea:
  free_urlhandle(u);
  u->scratch = (char *)0x0;
  u->portnum = 0;
  u->query = (char *)0x0;
  u->fragment = (char *)0x0;
  u->port = (char *)0x0;
  u->path = (char *)0x0;
  u->host = (char *)0x0;
  u->zoneid = (char *)0x0;
  u->password = (char *)0x0;
  u->options = (char *)0x0;
  u->scheme = (char *)0x0;
  u->user = (char *)0x0;
  return CVar10;
}

Assistant:

static CURLUcode parseurl(const char *url, CURLU *u, unsigned int flags)
{
  CURLUcode result = seturl(url, u, flags);
  if(result) {
    free_urlhandle(u);
    memset(u, 0, sizeof(struct Curl_URL));
  }
  return result;
}